

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# synchcontrollers.cpp
# Opt level: O1

PAL_ERROR __thiscall
CorUnix::CSynchStateController::SetOwner(CSynchStateController *this,CPalThread *pNewOwningThread)

{
  uint uVar1;
  CSynchData *pCVar2;
  FILE *__stream;
  PAL_ERROR PVar3;
  LONG LVar4;
  uint uVar5;
  CPalThread *pCVar6;
  
  pCVar6 = (CPalThread *)pthread_getspecific(thObjKey);
  if (pCVar6 == (CPalThread *)0x0) {
    pCVar6 = CreateCurrentThreadData();
  }
  if (pCVar6 != (this->super_CSynchControllerBase).m_pthrOwner) {
    fprintf(_stderr,"] %s %s:%d","SetOwner",
            "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/pal/src/synchmgr/synchcontrollers.cpp"
            ,0x27a);
    fprintf(_stderr,"Expression: InternalGetCurrentThread() == m_pthrOwner\n");
  }
  if (pNewOwningThread == (CPalThread *)0x0) {
    fprintf(_stderr,"] %s %s:%d","SetOwner",
            "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/pal/src/synchmgr/synchcontrollers.cpp"
            ,0x27b);
    fprintf(_stderr,"Expression: NULL != pNewOwningThread\n");
  }
  if (((this->super_CSynchControllerBase).m_potObjectType)->m_eOwnershipSemantics !=
      OwnershipTracked) {
    fprintf(_stderr,"] %s %s:%d","SetOwner",
            "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/pal/src/synchmgr/synchcontrollers.cpp"
            ,0x27f);
    fprintf(_stderr,
            "Expression: CObjectType::OwnershipTracked == m_potObjectType->GetOwnershipSemantics(), Description: SetOwner called on an object without OwnershipTracked semantics\n"
           );
  }
  pCVar2 = (this->super_CSynchControllerBase).m_psdSynchData;
  if (pCVar2->m_lOwnershipCount == 0) {
    PVar3 = CSynchData::AssignOwnershipToThread
                      (pCVar2,(this->super_CSynchControllerBase).m_pthrOwner,pNewOwningThread);
    pCVar2 = (this->super_CSynchControllerBase).m_psdSynchData;
    if (pCVar2->m_lOwnershipCount != 0) {
      LVar4 = CSynchData::GetSignalCount(pCVar2);
      if (LVar4 != 0) {
        fprintf(_stderr,"] %s %s:%d","SetOwner",
                "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/pal/src/synchmgr/synchcontrollers.cpp"
                ,0x290);
        __stream = _stderr;
        pCVar2 = (this->super_CSynchControllerBase).m_psdSynchData;
        uVar1 = pCVar2->m_lOwnershipCount;
        uVar5 = CSynchData::GetSignalCount(pCVar2);
        fprintf(__stream,
                "Expression: 0 == m_psdSynchData->GetOwnershipCount() || 0 == m_psdSynchData->GetSignalCount(), Description: Conflicting values for SignalCount [%d] and OwnershipCount [%d]\n"
                ,(ulong)uVar1,(ulong)uVar5);
      }
    }
  }
  else {
    fprintf(_stderr,"] %s %s:%d","SetOwner",
            "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/pal/src/synchmgr/synchcontrollers.cpp"
            ,0x283);
    fprintf(_stderr,"Ownership count should be zero at this time\n");
    PVar3 = 0x54f;
  }
  return PVar3;
}

Assistant:

PAL_ERROR CSynchStateController::SetOwner(CPalThread * pNewOwningThread)
    {
        VALIDATEOBJECT(m_psdSynchData);
        
        PAL_ERROR palErr = NO_ERROR;

        _ASSERTE(InternalGetCurrentThread() == m_pthrOwner);
        _ASSERTE(NULL != pNewOwningThread);
        _ASSERT_MSG(CObjectType::OwnershipTracked == 
                    m_potObjectType->GetOwnershipSemantics(),
                    "SetOwner called on an object without OwnershipTracked "
                    "semantics\n");
        
        if (0 != m_psdSynchData->GetOwnershipCount())
        {
            ASSERT("Ownership count should be zero at this time\n");
            palErr = ERROR_INTERNAL_ERROR;
            goto SO_exit;
        }

        palErr = m_psdSynchData->AssignOwnershipToThread(m_pthrOwner, 
                                                       pNewOwningThread);

        _ASSERT_MSG(0 == m_psdSynchData->GetOwnershipCount() || 
                    0 == m_psdSynchData->GetSignalCount(),
                    "Conflicting values for SignalCount [%d] and "
                    "OwnershipCount [%d]\n", 
                    m_psdSynchData->GetOwnershipCount(), 
                    m_psdSynchData->GetSignalCount());
        
    SO_exit:
        return palErr;
    }